

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

bool __thiscall
CriticalSection::insertNodes
          (CriticalSection *this,set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *nodes)

{
  size_type sVar1;
  size_type sVar2;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *in_RDI;
  size_type sizeAfter;
  size_type sizeBefore;
  _Rb_tree_header *this_00;
  _Rb_tree_const_iterator<Node_*> in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<Node_*> in_stack_ffffffffffffffd0;
  
  sVar1 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size
                    ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1af0a1);
  this_00 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)this_00);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end
            ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)this_00);
  std::set<Node*,std::less<Node*>,std::allocator<Node*>>::
  insert<std::_Rb_tree_const_iterator<Node*>>
            (in_RDI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::erase(in_RDI,(key_type *)this_00);
  sVar2 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::size
                    ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1af113);
  return sVar1 < sVar2;
}

Assistant:

bool CriticalSection::insertNodes(const std::set<Node *> &nodes) {
    auto sizeBefore = this->nodes_.size();
    this->nodes_.insert(nodes.begin(), nodes.end());
    this->nodes_.erase(lock_);
    auto sizeAfter = this->nodes_.size();
    return sizeBefore < sizeAfter;
}